

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void opj_dwt_decode_v_func(void *user_data,opj_tls_t *tls)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *(uint *)((long)user_data + 0x28);
  while( true ) {
    uVar1 = *(uint *)((long)user_data + 0x2c);
    if (uVar1 < uVar2 + 8) break;
    opj_idwt53_v((opj_dwt_t *)user_data,
                 (OPJ_INT32 *)((ulong)uVar2 * 4 + *(long *)((long)user_data + 0x20)),
                 (ulong)*(uint *)((long)user_data + 0x1c),8);
    uVar2 = uVar2 + 8;
  }
  if (uVar2 <= uVar1 && uVar1 - uVar2 != 0) {
    opj_idwt53_v((opj_dwt_t *)user_data,
                 (OPJ_INT32 *)((ulong)uVar2 * 4 + *(long *)((long)user_data + 0x20)),
                 (ulong)*(uint *)((long)user_data + 0x1c),uVar1 - uVar2);
  }
  opj_aligned_free(*user_data);
  opj_free(user_data);
  return;
}

Assistant:

static void opj_dwt_decode_v_func(void* user_data, opj_tls_t* tls)
{
    OPJ_UINT32 j;
    opj_dwd_decode_v_job_t* job;
    (void)tls;

    job = (opj_dwd_decode_v_job_t*)user_data;
    for (j = job->min_j; j + PARALLEL_COLS_53 <= job->max_j;
            j += PARALLEL_COLS_53) {
        opj_idwt53_v(&job->v, &job->tiledp[j], (OPJ_SIZE_T)job->w,
                     PARALLEL_COLS_53);
    }
    if (j < job->max_j)
        opj_idwt53_v(&job->v, &job->tiledp[j], (OPJ_SIZE_T)job->w,
                     (OPJ_INT32)(job->max_j - j));

    opj_aligned_free(job->v.mem);
    opj_free(job);
}